

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_len(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  size_t sVar2;
  long in_RDX;
  vm_val_t *in_RDI;
  utf8_ptr p;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  utf8_ptr in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_len::desc,0);
    __cxa_guard_release(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_stack_ffffffffffffffc0.p_,
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffffc0);
    utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffc0,(char *)(in_RDX + 2));
    vmb_get_len((char *)0x38e48f);
    sVar2 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffffc0.p_,(size_t)in_RDI);
    vm_val_t::set_int(in_RDI,(int32_t)sVar2);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_len(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                           const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up a utf-8 pointer to the string's contents */
    utf8_ptr p;
    p.set((char *)str + VMB_LEN);

    /* return the character length of the string */
    retval->set_int(p.len(vmb_get_len(str)));

    /* handled */
    return TRUE;
}